

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
ft::list<double,_ft::allocator<double>_>::push_back
          (list<double,_ft::allocator<double>_> *this,value_type_conflict1 *val)

{
  listNode<double> *plVar1;
  listNode<double> *plVar2;
  listNode<double> *this_00;
  listNode<double> local_38;
  
  this_00 = (listNode<double> *)operator_new(0x18);
  local_38.data = *val;
  local_38.prev = (listNode<double> *)0x0;
  local_38.next = (listNode<double> *)0x0;
  listNode<double>::listNode(this_00,&local_38);
  plVar1 = this->m_tail;
  plVar2 = plVar1->prev;
  this_00->prev = plVar2;
  plVar2->next = this_00;
  this_00->next = plVar1;
  plVar1->prev = this_00;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void push_back(value_type const & val) {
		node*	newNode = this->m_alloc.allocate(1);
		this->m_alloc.construct(newNode, val);
		newNode->prev = this->tail()->prev;
		newNode->prev->next = newNode;
		newNode->next = this->tail();
		this->tail()->prev = newNode;
		++this->m_size;
	}